

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,int,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseShiftLeftOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,true,false>
               (string_t *ldata,int *rdata,string_t *result_data,idx_t count,ValidityMask *mask,
               anon_class_8_1_6971b95b fun)

{
  string_t left;
  string_t left_00;
  bool bVar1;
  undefined8 *puVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  ValidityMask *in_R9;
  string_t sVar3;
  int rentry_2;
  string_t lentry_2;
  idx_t i;
  int rentry_1;
  string_t lentry_1;
  idx_t start;
  int rentry;
  string_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  ValidityMask *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  anon_class_8_1_6971b95b in_stack_ffffffffffffff00;
  ulong local_f0;
  undefined8 local_d0;
  undefined8 local_c8;
  idx_t local_a8;
  unsigned_long local_a0;
  undefined8 local_98;
  undefined8 local_90;
  ValidityMask *local_88;
  undefined1 local_80 [20];
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  TemplatedValidityMask<unsigned_long> *local_30;
  unsigned_long local_28;
  void *local_20;
  void *local_18;
  undefined8 *local_10;
  ValidityMask *local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_R9;
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + in_RCX * 4),in_RDX,
             (void *)((long)in_RDX + in_RCX * 0x10),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_30);
  if (bVar1) {
    for (local_f0 = 0; local_f0 < local_28; local_f0 = local_f0 + 1) {
      sVar3.value._8_4_ = in_stack_fffffffffffffef8;
      sVar3.value._0_8_ = in_stack_fffffffffffffef0;
      sVar3.value._12_4_ = *(undefined4 *)((long)local_18 + local_f0 * 4);
      sVar3 = BinaryLambdaWrapper::
              Operation<duckdb::BitwiseShiftLeftOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,int,duckdb::string_t>
                        ((Vector *)*local_10,sVar3,in_stack_fffffffffffffeec,local_8,local_10[1]);
      in_stack_fffffffffffffeec = sVar3.value._4_4_;
      in_stack_fffffffffffffef0 = sVar3.value._8_8_;
      puVar2 = (undefined8 *)((long)local_20 + local_f0 * 0x10);
      *puVar2 = sVar3.value._0_8_;
      puVar2[1] = in_stack_fffffffffffffef0;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0xe396d5);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_28);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_98 = *local_10;
          local_90 = local_10[1];
          local_6c = *(undefined4 *)((long)local_18 + local_38 * 4);
          local_88 = local_8;
          left.value._8_4_ = in_stack_fffffffffffffef8;
          left.value._0_8_ = in_stack_fffffffffffffef0;
          left.value._12_4_ = in_stack_fffffffffffffefc;
          local_68 = local_98;
          local_60 = local_90;
          local_80._0_16_ =
               (undefined1  [16])
               BinaryLambdaWrapper::
               Operation<duckdb::BitwiseShiftLeftOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,int,duckdb::string_t>
                         (in_stack_ffffffffffffff00,left,in_stack_fffffffffffffeec,
                          in_stack_fffffffffffffee0,(idx_t)in_stack_fffffffffffffed8);
          puVar2 = (undefined8 *)((long)local_20 + local_38 * 0x10);
          *puVar2 = local_80._0_8_;
          puVar2[1] = local_80._8_8_;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_a0 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_a8 = local_38 - local_a0;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a8);
            if (bVar1) {
              left_00.value._8_4_ = in_stack_fffffffffffffef8;
              left_00.value._0_8_ = in_stack_fffffffffffffef0;
              left_00.value._12_4_ = in_stack_fffffffffffffefc;
              sVar3 = BinaryLambdaWrapper::
                      Operation<duckdb::BitwiseShiftLeftOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,int,duckdb::string_t>
                                (in_stack_ffffffffffffff00,left_00,in_stack_fffffffffffffeec,
                                 in_stack_fffffffffffffee0,(idx_t)in_stack_fffffffffffffed8);
              puVar2 = (undefined8 *)((long)local_20 + local_38 * 0x10);
              local_d0 = sVar3.value._0_8_;
              *puVar2 = local_d0;
              local_c8 = sVar3.value._8_8_;
              puVar2[1] = local_c8;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}